

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedFile.cpp
# Opt level: O0

void __thiscall cat::MappedView::Close(MappedView *this)

{
  long *in_RDI;
  
  if (*in_RDI != -1) {
    munmap((void *)*in_RDI,(ulong)*(uint *)(in_RDI + 4));
    *in_RDI = -1;
  }
  in_RDI[2] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

void MappedView::Close()
{
#if defined(CAT_OS_WINDOWS)

    if (Data)
    {
        ::UnmapViewOfFile(Data);
        Data = 0;
    }

    if (Map)
    {
        ::CloseHandle(Map);
        Map = 0;
    }

#else

    if (Map != MAP_FAILED)
    {
        munmap(Map, Length);
        Map = MAP_FAILED;
    }

    Data = 0;

#endif

    Length = 0;
    Offset = 0;
}